

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void s390x_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  CPUS390XState_conflict *env_00;
  int iVar1;
  DisasJumpType DVar2;
  uint64_t page_start;
  DisasContextBase *__mptr;
  DisasContext_conflict13 *dc;
  CPUS390XState_conflict *env;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  env_00 = (CPUS390XState_conflict *)cs->env_ptr;
  iVar1 = uc_addr_is_exit((uc_struct *)dcbase[3].pc_first,dcbase->pc_next);
  if (iVar1 == 0) {
    DVar2 = translate_one(env_00,(DisasContext_conflict13 *)dcbase);
    dcbase->is_jmp = DVar2;
    if ((dcbase->is_jmp == DISAS_NEXT) &&
       ((0xfff < dcbase->pc_next - (dcbase->pc_first & 0xfffffffffffff000) ||
        (dcbase[2].pc_next != 0)))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    dcbase->is_jmp = DISAS_TARGET_11;
  }
  return;
}

Assistant:

static void s390x_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUS390XState *env = cs->env_ptr;
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate PGM exception to halt emulation
        dcbase->is_jmp = DISAS_UNICORN_HALT;
    } else {
        dc->base.is_jmp = translate_one(env, dc);
        if (dc->base.is_jmp == DISAS_NEXT) {
            uint64_t page_start;

            page_start = dc->base.pc_first & TARGET_PAGE_MASK;
            if (dc->base.pc_next - page_start >= TARGET_PAGE_SIZE || dc->ex_value) {
                dc->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}